

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall
UtestShellPointerArray::UtestShellPointerArray(UtestShellPointerArray *this,UtestShell *firstTest)

{
  int iVar1;
  undefined4 extraout_var;
  UtestShell **ppUVar2;
  undefined4 extraout_var_00;
  ulong uVar3;
  
  this->arrayOfTests_ = (UtestShell **)0x0;
  this->count_ = 0;
  if (firstTest == (UtestShell *)0x0) {
    uVar3 = 0;
  }
  else {
    iVar1 = (*firstTest->_vptr_UtestShell[4])();
    uVar3 = CONCAT44(extraout_var,iVar1);
  }
  this->count_ = uVar3;
  if (uVar3 != 0) {
    ppUVar2 = (UtestShell **)
              operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 << 3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/Utest.cpp"
                             ,0x380);
    this->arrayOfTests_ = ppUVar2;
    if (this->count_ != 0) {
      uVar3 = 0;
      do {
        this->arrayOfTests_[uVar3] = firstTest;
        iVar1 = (*firstTest->_vptr_UtestShell[3])(firstTest);
        firstTest = (UtestShell *)CONCAT44(extraout_var_00,iVar1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->count_);
    }
  }
  return;
}

Assistant:

UtestShellPointerArray::UtestShellPointerArray(UtestShell* firstTest)
    : arrayOfTests_(NULLPTR), count_(0)
{
    count_ = (firstTest) ? firstTest->countTests() : 0;
    if (count_ == 0) return;

    arrayOfTests_ = new UtestShell*[count_];

    UtestShell*currentTest = firstTest;
    for (size_t i = 0; i < count_; i++)
    {
        arrayOfTests_[i] = currentTest;
        currentTest = currentTest->getNext();
    }
}